

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix.c++
# Opt level: O0

void kj::UnixEventPort::setReservedSignal(int signum)

{
  Fault local_30;
  Fault f_1;
  Fault local_18;
  Fault f;
  int signum_local;
  
  f.exception._4_4_ = signum;
  if ((((anonymous_namespace)::tooLateToSetReserved ^ 0xff) & 1) == 0) {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[120]>
              (&local_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix.c++"
               ,0xfd,FAILED,"!tooLateToSetReserved",
               "\"setReservedSignal() must be called before any calls to `captureSignal()` and \" \"before any `UnixEventPort` is constructed.\""
               ,(char (*) [120])
                "setReservedSignal() must be called before any calls to `captureSignal()` and before any `UnixEventPort` is constructed."
              );
    _::Debug::Fault::fatal(&local_18);
  }
  if (((anonymous_namespace)::reservedSignal != 10) &&
     ((anonymous_namespace)::reservedSignal != signum)) {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[136]>
              (&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix.c++"
               ,0x100,FAILED,(char *)0x0,
               "\"Detected multiple conflicting calls to setReservedSignal().  Please only \" \"call this once, or always call it with the same signal number.\""
               ,(char (*) [136])
                "Detected multiple conflicting calls to setReservedSignal().  Please only call this once, or always call it with the same signal number."
              );
    _::Debug::Fault::fatal(&local_30);
  }
  (anonymous_namespace)::reservedSignal = signum;
  return;
}

Assistant:

void UnixEventPort::setReservedSignal(int signum) {
  KJ_REQUIRE(!tooLateToSetReserved,
             "setReservedSignal() must be called before any calls to `captureSignal()` and "
             "before any `UnixEventPort` is constructed.");
  if (reservedSignal != SIGUSR1 && reservedSignal != signum) {
    KJ_FAIL_REQUIRE("Detected multiple conflicting calls to setReservedSignal().  Please only "
                    "call this once, or always call it with the same signal number.");
  }
  reservedSignal = signum;
}